

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O2

void do_search(CHAR_DATA *ch,char *argument)

{
  OBJ_DATA *obj;
  bool bVar1;
  int iVar2;
  int iVar3;
  CClass *this;
  OBJ_AFFECT_DATA *pOVar4;
  OBJ_DATA **ppOVar5;
  
  act("You intently scrutinize your surroundings...",ch,(void *)0x0,(void *)0x0,3);
  act("$n intently scrutinizes $s surroundings...",ch,(void *)0x0,(void *)0x0,0);
  iVar2 = number_percent();
  ppOVar5 = &ch->in_room->contents;
  while (obj = *ppOVar5, obj != (OBJ_DATA *)0x0) {
    bVar1 = is_affected_obj(obj,(int)gsn_stash);
    if (bVar1) {
      pOVar4 = (OBJ_AFFECT_DATA *)&obj->affected;
      while ((pOVar4 = pOVar4->next, pOVar4 != (OBJ_AFFECT_DATA *)0x0 && (pOVar4->type != gsn_stash)
             )) {
        iVar2 = iVar2 + ((int)ch->level - (int)pOVar4->level);
        this = char_data::Class(ch);
        iVar3 = CClass::GetIndex(this);
        if (iVar3 == 2) {
          iVar2 = iVar2 + ch->level / 2;
        }
        if (pOVar4->owner != ch) {
          iVar3 = number_percent();
          if (iVar3 < iVar2) {
            affect_strip_obj(obj,(int)gsn_stash);
            act("You stumble across $p which seemed to be hidden from your eye.",ch,obj,(void *)0x0,
                3);
            act("$n stumbles across and reveals $p.",ch,obj,(void *)0x0,0);
          }
        }
      }
    }
    ppOVar5 = &obj->next_content;
  }
  WAIT_STATE(ch,0x18);
  return;
}

Assistant:

void do_search(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *obj = nullptr;
	OBJ_AFFECT_DATA *oaf;
	int chance;

	act("You intently scrutinize your surroundings...", ch, 0, 0, TO_CHAR);
	act("$n intently scrutinizes $s surroundings...", ch, 0, 0, TO_ROOM);

	chance = number_percent();

	for (obj = ch->in_room->contents; obj != nullptr; obj = obj->next_content)
	{
		if (is_affected_obj(obj, gsn_stash))
		{
			for (oaf = obj->affected; oaf != nullptr; oaf = oaf->next)
			{
				if (oaf->type == gsn_stash)
					break;

				chance += (ch->level - oaf->level);

				if (ch->Class()->GetIndex() == CLASS_THIEF)
					chance += (ch->level / 2);

				if (oaf->owner != ch && (number_percent() < chance))
				{
					affect_strip_obj(obj, gsn_stash);
					act("You stumble across $p which seemed to be hidden from your eye.", ch, obj, 0, TO_CHAR);
					act("$n stumbles across and reveals $p.", ch, obj, 0, TO_ROOM);
				}
			}
		}
	}

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}